

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O0

void burst::detail::
     radix_sort_impl_bi_iteration<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*>
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
               __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
               double *buffer_begin,long param_4,long param_5,
               compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *param_6)

{
  compose_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_algorithm_detail_nth_radix_hpp:19:17),_burst::compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn>_>
  map;
  compose_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_algorithm_detail_nth_radix_hpp:19:17),_burst::compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn>_>
  map_00;
  difference_type __n;
  compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *pcVar1;
  long *counters;
  anon_class_16_2_5243436b *local_158 [2];
  compose_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_algorithm_detail_nth_radix_hpp:19:17),_burst::compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn>_>
  local_148;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_130;
  double *local_128;
  move_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_120;
  double *local_118;
  move_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_110;
  double *local_100;
  double *local_f8;
  double *local_f0;
  anon_class_16_2_5243436b *local_e0 [2];
  compose_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_algorithm_detail_nth_radix_hpp:19:17),_burst::compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn>_>
  local_d0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b8;
  double *local_b0;
  move_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_a8;
  double *local_a0;
  move_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_98;
  double *local_90;
  double *local_88;
  double *local_80;
  double *local_78;
  byte local_6a;
  undefined1 local_69;
  bool n1th_is_single;
  double *pdStack_68;
  bool nth_is_single;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> buffer_end;
  difference_type range_size;
  size_t radix_number_local;
  long *maximums_local;
  long (*counters_local) [256];
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Stack_20;
  compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> map_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> buffer_begin_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first_local;
  
  buffer_end._M_current = last._M_current;
  _Stack_20._M_current = buffer_begin;
  __n = std::
        distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (first,last);
  pdStack_68 = _Stack_20._M_current;
  local_60 = std::
             next<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (_Stack_20,__n);
  local_69 = *(long *)(param_5 + (long)param_6 * 8) == __n;
  local_6a = *(long *)(param_5 + 8 + (long)param_6 * 8) == __n;
  if ((!(bool)local_69) || (!(bool)local_6a)) {
    if ((bool)local_69) {
      local_88 = _Stack_20._M_current;
      pcVar1 = param_6;
      local_80 = last._M_current;
      local_78 = first._M_current;
      local_90 = (double *)
                 std::
                 move<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                           (first,last,_Stack_20);
    }
    else {
      pcVar1 = param_6;
      local_a0 = first._M_current;
      local_98 = std::
                 make_move_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                           (first);
      local_b0 = last._M_current;
      local_a8 = std::
                 make_move_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                           (last);
      local_b8._M_current = _Stack_20._M_current;
      local_e0[0] = nth_radix<burst::low_byte_fn>(param_6);
      compose<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>&>
                (&local_d0,(burst *)local_e0,(anon_class_16_2_5243436b *)((long)&counters_local + 6)
                 ,pcVar1);
      pcVar1 = (compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn> *)
               std::begin<long,256ul>((long (*) [256])(param_4 + (long)param_6 * 0x800));
      map.l._8_8_ = local_d0.l._8_8_;
      map.l.radix_number = local_d0.l.radix_number;
      map.r = local_d0.r;
      map._18_6_ = local_d0._18_6_;
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>>,long*>
                (local_98,local_a8,local_b8,map,(long *)pcVar1);
    }
    if ((local_6a & 1) == 0) {
      local_118 = _Stack_20._M_current;
      local_110 = std::
                  make_move_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            (_Stack_20);
      local_128 = local_60._M_current;
      local_120 = std::
                  make_move_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            (local_60);
      local_130._M_current = first._M_current;
      local_158[0] = nth_radix<burst::low_byte_fn>(&param_6->field_0x1);
      compose<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>&>
                (&local_148,(burst *)local_158,
                 (anon_class_16_2_5243436b *)((long)&counters_local + 6),pcVar1);
      counters = std::begin<long,256ul>
                           ((long (*) [256])(param_4 + (long)&param_6->field_0x1 * 0x800));
      map_00.l._8_8_ = local_148.l._8_8_;
      map_00.l.radix_number = local_148.l.radix_number;
      map_00.r = local_148.r;
      map_00._18_6_ = local_148._18_6_;
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>>,long*>
                (local_110,local_120,local_130,map_00,counters);
    }
    else {
      local_f0 = _Stack_20._M_current;
      local_f8 = local_60._M_current;
      local_100 = first._M_current;
      std::
      move<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (_Stack_20,local_60,first);
    }
  }
  return;
}

Assistant:

void
            radix_sort_impl_bi_iteration
            (
                RandomAccessIterator1 first,
                RandomAccessIterator1 last,
                RandomAccessIterator2 buffer_begin,
                Map map,
                Radix radix,
                RandomAccessIterator3 counters,
                RandomAccessIterator4 maximums,
                std::size_t radix_number
            )
        {
            using std::distance;
            const auto range_size = distance(first, last);
            const auto buffer_end = std::next(buffer_begin, range_size);

            const auto nth_is_single = maximums[radix_number] == range_size;
            const auto n1th_is_single = maximums[radix_number + 1] == range_size;

            if (nth_is_single && n1th_is_single)
            {
                return;
            }

            if (nth_is_single)
            {
                std::move(first, last, buffer_begin);
            }
            else
            {
                dispose_backward(std::make_move_iterator(first), std::make_move_iterator(last), buffer_begin, compose(nth_radix(radix_number, radix), map), std::begin(counters[radix_number]));
            }

            if (n1th_is_single)
            {
                std::move(buffer_begin, buffer_end, first);
            }
            else
            {
                dispose_backward(std::make_move_iterator(buffer_begin), std::make_move_iterator(buffer_end), first, compose(nth_radix(radix_number + 1, radix), map), std::begin(counters[radix_number + 1]));
            }
        }